

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ConstructBloomFilter(WhereInfo *pWInfo,int iLevel,WhereLevel *pLevel,Bitmask notReady)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  int p1;
  Parse *pParse;
  Vdbe *p;
  SrcList *pSVar4;
  Vdbe *p_00;
  WhereLoop *pWVar5;
  Table *pTVar6;
  Index *pIVar7;
  int addr;
  int x;
  int iVar8;
  sqlite3 *psVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  uint i;
  int iVar13;
  WhereLoop *pWVar14;
  WhereTerm *pWVar15;
  WhereTerm *pWVar16;
  ulong uVar17;
  sqlite3_str local_b8;
  char local_98 [104];
  
  uVar17 = (ulong)(uint)iLevel;
  pParse = pWInfo->pParse;
  p = pParse->pVdbe;
  pWVar14 = pLevel->pWLoop;
  addr = sqlite3VdbeAddOp0(p,0xf);
  psVar9 = pParse->db;
  while( true ) {
    pSVar4 = pWInfo->pTabList;
    bVar2 = pLevel->iFrom;
    p_00 = pParse->pVdbe;
    local_b8.zText = local_98;
    local_b8.nAlloc = 100;
    local_b8.mxAlloc = 1000000000;
    local_b8.nChar = 0;
    local_b8.accError = '\0';
    local_b8.printfFlags = '\x01';
    local_b8.db = psVar9;
    sqlite3_str_appendf(&local_b8,"BLOOM FILTER ON %S (",pSVar4->a + bVar2);
    pWVar5 = pLevel->pWLoop;
    if ((pWVar5->wsFlags & 0x100) == 0) {
      for (i = (uint)pWVar5->nSkip; i < (pWVar5->u).btree.nEq; i = i + 1) {
        pcVar10 = explainIndexColumnName((pWVar5->u).btree.pIndex,i);
        if (pWVar5->nSkip < i) {
          sqlite3_str_append(&local_b8," AND ",5);
        }
        sqlite3_str_appendf(&local_b8,"%s=?",pcVar10);
      }
    }
    else {
      pTVar6 = pSVar4->a[bVar2].pTab;
      lVar11 = (long)pTVar6->iPKey;
      if (lVar11 < 0) {
        sqlite3_str_appendf(&local_b8,"rowid=?");
      }
      else {
        sqlite3_str_appendf(&local_b8,"%s=?",pTVar6->aCol[lVar11].zCnName);
      }
    }
    sqlite3_str_append(&local_b8,")",1);
    pcVar10 = sqlite3StrAccumFinish(&local_b8);
    sqlite3VdbeAddOp4(p_00,0xb9,p_00->nOp,pParse->addrExplain,0,pcVar10,-6);
    x = pParse->nLabel + -1;
    pParse->nLabel = x;
    p1 = pLevel->iTabCur;
    iVar13 = pParse->nMem + 1;
    pParse->nMem = iVar13;
    pLevel->regFilter = iVar13;
    pSVar4 = pWInfo->pTabList;
    bVar2 = pLevel->iFrom;
    uVar12 = sqlite3LogEstToInt((pSVar4->a[bVar2].pTab)->nRowLogEst);
    if (9999999 < uVar12) {
      uVar12 = 10000000;
    }
    if (uVar12 < 0x2711) {
      uVar12 = 10000;
    }
    sqlite3VdbeAddOp2(p,0x4d,(int)uVar12,iVar13);
    iVar13 = sqlite3VdbeAddOp1(p,0x24,p1);
    pWVar16 = (pWInfo->sWC).a;
    pWVar15 = pWVar16 + (pWInfo->sWC).nTerm;
    for (; pWVar16 < pWVar15; pWVar16 = pWVar16 + 1) {
      if ((pWVar16->wtFlags & 2) == 0) {
        iVar8 = sqlite3ExprIsTableConstraint(pWVar16->pExpr,pSVar4->a + bVar2);
        if (iVar8 != 0) {
          sqlite3ExprIfFalse(pParse,pWVar16->pExpr,x,0x10);
        }
      }
    }
    if ((pWVar14->wsFlags & 0x100) == 0) {
      pIVar7 = (pWVar14->u).btree.pIndex;
      uVar3 = (pWVar14->u).btree.nEq;
      iVar8 = sqlite3GetTempRange(pParse,(uint)uVar3);
      for (uVar12 = 0; uVar3 != uVar12; uVar12 = uVar12 + 1) {
        sqlite3ExprCodeGetColumnOfTable
                  (p,pIVar7->pTable,p1,(int)pIVar7->aiColumn[uVar12],iVar8 + (int)uVar12);
      }
      sqlite3VdbeAddOp4Int(p,0xb4,pLevel->regFilter,0,iVar8,(uint)uVar3);
      sqlite3ReleaseTempRange(pParse,iVar8,(uint)uVar3);
    }
    else {
      iVar8 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0x87,p1,iVar8);
      sqlite3VdbeAddOp4Int(p,0xb4,pLevel->regFilter,0,iVar8,1);
      if (iVar8 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = iVar8;
        }
      }
    }
    sqlite3VdbeResolveLabel(p,x);
    sqlite3VdbeAddOp2(p,0x27,pLevel->iTabCur,iVar13 + 1);
    sqlite3VdbeJumpHere(p,iVar13);
    pbVar1 = (byte *)((long)&pWVar14->wsFlags + 2);
    *pbVar1 = *pbVar1 & 0xbf;
    psVar9 = pParse->db;
    if ((psVar9->dbOptFlags & 0x100000) != 0) break;
    uVar17 = (ulong)(int)uVar17;
    pLevel = (WhereLevel *)(pWInfo[1].aiCurOnePass + uVar17 * 0x1c + -10);
    while( true ) {
      uVar17 = uVar17 + 1;
      if ((long)(ulong)pWInfo->nLevel <= (long)uVar17) goto LAB_001a8543;
      if (((((pWInfo->pTabList->a[pLevel->iFrom].fg.jointype & 0x48) == 0) &&
           (pWVar14 = pLevel->pWLoop, pWVar14 != (WhereLoop *)0x0)) &&
          ((pWVar14->prereq & notReady) == 0)) && ((pWVar14->wsFlags & 0x400004) == 0x400000))
      break;
      pLevel = pLevel + 1;
    }
    if ((long)(ulong)pWInfo->nLevel <= (long)uVar17) break;
  }
LAB_001a8543:
  sqlite3VdbeJumpHere(p,addr);
  return;
}

Assistant:

static SQLITE_NOINLINE void sqlite3ConstructBloomFilter(
  WhereInfo *pWInfo,    /* The WHERE clause */
  int iLevel,           /* Index in pWInfo->a[] that is pLevel */
  WhereLevel *pLevel,   /* Make a Bloom filter for this FROM term */
  Bitmask notReady      /* Loops that are not ready */
){
  int addrOnce;                        /* Address of opening OP_Once */
  int addrTop;                         /* Address of OP_Rewind */
  int addrCont;                        /* Jump here to skip a row */
  const WhereTerm *pTerm;              /* For looping over WHERE clause terms */
  const WhereTerm *pWCEnd;             /* Last WHERE clause term */
  Parse *pParse = pWInfo->pParse;      /* Parsing context */
  Vdbe *v = pParse->pVdbe;             /* VDBE under construction */
  WhereLoop *pLoop = pLevel->pWLoop;   /* The loop being coded */
  int iCur;                            /* Cursor for table getting the filter */

  assert( pLoop!=0 );
  assert( v!=0 );
  assert( pLoop->wsFlags & WHERE_BLOOMFILTER );

  addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  do{
    const SrcItem *pItem;
    const Table *pTab;
    u64 sz;
    sqlite3WhereExplainBloomFilter(pParse, pWInfo, pLevel);
    addrCont = sqlite3VdbeMakeLabel(pParse);
    iCur = pLevel->iTabCur;
    pLevel->regFilter = ++pParse->nMem;

    /* The Bloom filter is a Blob held in a register.  Initialize it
    ** to zero-filled blob of at least 80K bits, but maybe more if the
    ** estimated size of the table is larger.  We could actually
    ** measure the size of the table at run-time using OP_Count with
    ** P3==1 and use that value to initialize the blob.  But that makes
    ** testing complicated.  By basing the blob size on the value in the
    ** sqlite_stat1 table, testing is much easier.
    */
    pItem = &pWInfo->pTabList->a[pLevel->iFrom];
    assert( pItem!=0 );
    pTab = pItem->pTab;
    assert( pTab!=0 );
    sz = sqlite3LogEstToInt(pTab->nRowLogEst);
    if( sz<10000 ){
      sz = 10000;
    }else if( sz>10000000 ){
      sz = 10000000;
    }
    sqlite3VdbeAddOp2(v, OP_Blob, (int)sz, pLevel->regFilter);

    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, iCur); VdbeCoverage(v);
    pWCEnd = &pWInfo->sWC.a[pWInfo->sWC.nTerm];
    for(pTerm=pWInfo->sWC.a; pTerm<pWCEnd; pTerm++){
      Expr *pExpr = pTerm->pExpr;
      if( (pTerm->wtFlags & TERM_VIRTUAL)==0
       && sqlite3ExprIsTableConstraint(pExpr, pItem)
      ){
        sqlite3ExprIfFalse(pParse, pTerm->pExpr, addrCont, SQLITE_JUMPIFNULL);
      }
    }
    if( pLoop->wsFlags & WHERE_IPK ){
      int r1 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(v, OP_Rowid, iCur, r1);
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, 1);
      sqlite3ReleaseTempReg(pParse, r1);
    }else{
      Index *pIdx = pLoop->u.btree.pIndex;
      int n = pLoop->u.btree.nEq;
      int r1 = sqlite3GetTempRange(pParse, n);
      int jj;
      for(jj=0; jj<n; jj++){
        int iCol = pIdx->aiColumn[jj];
        assert( pIdx->pTable==pItem->pTab );
        sqlite3ExprCodeGetColumnOfTable(v, pIdx->pTable, iCur, iCol,r1+jj);
      }
      sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0, r1, n);
      sqlite3ReleaseTempRange(pParse, r1, n);
    }
    sqlite3VdbeResolveLabel(v, addrCont);
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1);
    VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addrTop);
    pLoop->wsFlags &= ~WHERE_BLOOMFILTER;
    if( OptimizationDisabled(pParse->db, SQLITE_BloomPulldown) ) break;
    while( ++iLevel < pWInfo->nLevel ){
      const SrcItem *pTabItem;
      pLevel = &pWInfo->a[iLevel];
      pTabItem = &pWInfo->pTabList->a[pLevel->iFrom];
      if( pTabItem->fg.jointype & (JT_LEFT|JT_LTORJ) ) continue;
      pLoop = pLevel->pWLoop;
      if( NEVER(pLoop==0) ) continue;
      if( pLoop->prereq & notReady ) continue;
      if( (pLoop->wsFlags & (WHERE_BLOOMFILTER|WHERE_COLUMN_IN))
                 ==WHERE_BLOOMFILTER
      ){
        /* This is a candidate for bloom-filter pull-down (early evaluation).
        ** The test that WHERE_COLUMN_IN is omitted is important, as we are
        ** not able to do early evaluation of bloom filters that make use of
        ** the IN operator */
        break;
      }
    }
  }while( iLevel < pWInfo->nLevel );
  sqlite3VdbeJumpHere(v, addrOnce);
}